

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingEventExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange>
          (BumpAllocator *this,Type *args,TimingControl *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ClockingEventExpression *pCVar3;
  
  pCVar3 = (ClockingEventExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingEventExpression *)this->endPtr < pCVar3 + 1) {
    pCVar3 = (ClockingEventExpression *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pCVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pCVar3->super_Expression).kind = ClockingEvent;
  (pCVar3->super_Expression).type.ptr = args;
  (pCVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pCVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pCVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pCVar3->super_Expression).sourceRange.endLoc = SVar2;
  pCVar3->timingControl = args_1;
  return pCVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }